

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

Shader * vera::createShader(Shader *__return_storage_ptr__,string *_fragSrc,string *_vertSrc)

{
  string *_fragmentSrc;
  ulong uVar1;
  DefaultShaders _type;
  undefined1 auVar2 [12];
  string local_98;
  string local_78;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *_vertSrc_local;
  string *_fragSrc_local;
  Shader *s;
  
  local_21 = 0;
  local_20 = _vertSrc;
  _vertSrc_local = _fragSrc;
  _fragSrc_local = (string *)__return_storage_ptr__;
  Shader::Shader(__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    auVar2 = std::__cxx11::string::empty();
    _fragmentSrc = _vertSrc_local;
    if ((auVar2 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
      getDefaultSrc_abi_cxx11_(&local_48,(vera *)0x3,auVar2._8_4_);
      Shader::setSource(__return_storage_ptr__,_fragmentSrc,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      return __return_storage_ptr__;
    }
  }
  auVar2 = std::__cxx11::string::empty();
  if ((auVar2 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    Shader::setSource(__return_storage_ptr__,_vertSrc_local,local_20);
  }
  else {
    getDefaultSrc_abi_cxx11_(&local_78,(vera *)0x4,auVar2._8_4_);
    getDefaultSrc_abi_cxx11_(&local_98,(vera *)0x3,_type);
    Shader::setSource(__return_storage_ptr__,&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

Shader createShader(const std::string& _fragSrc, const std::string& _vertSrc) {
    Shader s;
    // s.addDefine("MODEL_VERTEX_COLOR", "v_color");
    // s.addDefine("MODEL_VERTEX_NORMAL", "v_normal");
    // s.addDefine("MODEL_VERTEX_TEXCOORD", "v_texcoord");
    // s.addDefine("MODEL_VERTEX_TANGENT", "v_tangent");

    if (!_fragSrc.empty() && _vertSrc.empty())
        s.setSource(_fragSrc, getDefaultSrc(VERT_DEFAULT_SCENE));
    else if (_fragSrc.empty())
        s.setSource(getDefaultSrc(FRAG_DEFAULT_SCENE), getDefaultSrc(VERT_DEFAULT_SCENE));
    else
        s.setSource(_fragSrc, _vertSrc);

    return s;
}